

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void net_tests::ipv4_peer_with_ipv6_addrMe_test_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_6e0;
  pointer local_6d8;
  char *local_6d0;
  char *local_6c8;
  pointer local_6c0;
  pointer local_6b8;
  char *local_6b0;
  char *local_6a8;
  pointer local_6a0;
  pointer local_698;
  char *local_690;
  char *local_688;
  pointer local_680;
  pointer local_678;
  char *local_670;
  char *local_668;
  pointer local_660;
  pointer local_658;
  char *local_650;
  char *local_648;
  basic_wrap_stringstream<char> local_640;
  ipv4_peer_with_ipv6_addrMe_test t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_648 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"ipv4_peer_with_ipv6_addrMe_test");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_660 = (pbVar3->_M_dataplus)._M_p;
  local_658 = local_660 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x253;
  file.m_begin = (iterator)&local_650;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_660,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  RegTestingSetup::RegTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_668 = "";
  memset(&local_640,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_640);
  std::operator<<((ostream *)&local_640,'\"');
  std::operator<<((ostream *)&local_640,"ipv4_peer_with_ipv6_addrMe_test");
  std::operator<<((ostream *)&local_640,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_640);
  local_680 = (pbVar3->_M_dataplus)._M_p;
  local_678 = local_680 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x253;
  file_00.m_begin = (iterator)&local_670;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_680,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_640);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_688 = "";
  memset(&local_640,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_640);
  std::operator<<((ostream *)&local_640,'\"');
  std::operator<<((ostream *)&local_640,"ipv4_peer_with_ipv6_addrMe_test");
  std::operator<<((ostream *)&local_640,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_640);
  local_6a0 = (pbVar3->_M_dataplus)._M_p;
  local_698 = local_6a0 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x253;
  file_01.m_begin = (iterator)&local_690;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6a0,msg_01);
  this = &local_640;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  ipv4_peer_with_ipv6_addrMe_test::test_method((ipv4_peer_with_ipv6_addrMe_test *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6a8 = "";
  memset(&local_640,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_640);
  std::operator<<((ostream *)&local_640,'\"');
  std::operator<<((ostream *)&local_640,"ipv4_peer_with_ipv6_addrMe_test");
  std::operator<<((ostream *)&local_640,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_640);
  local_6c0 = (pbVar3->_M_dataplus)._M_p;
  local_6b8 = local_6c0 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x253;
  file_02.m_begin = (iterator)&local_6b0;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6c0,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_640);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_6c8 = "";
  memset(&local_640,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_640);
  std::operator<<((ostream *)&local_640,'\"');
  std::operator<<((ostream *)&local_640,"ipv4_peer_with_ipv6_addrMe_test");
  std::operator<<((ostream *)&local_640,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_640);
  local_6e0 = (pbVar3->_M_dataplus)._M_p;
  local_6d8 = local_6e0 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x253;
  file_03.m_begin = (iterator)&local_6d0;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_6e0,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_640);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)&t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ipv4_peer_with_ipv6_addrMe_test)
{
    // set up local addresses; all that's necessary to reproduce the bug is
    // that a normal IPv4 address is among the entries, but if this address is
    // !IsRoutable the undefined behavior is easier to trigger deterministically
    in_addr raw_addr;
    raw_addr.s_addr = htonl(0x7f000001);
    const CNetAddr mapLocalHost_entry = CNetAddr(raw_addr);
    {
        LOCK(g_maplocalhost_mutex);
        LocalServiceInfo lsi;
        lsi.nScore = 23;
        lsi.nPort = 42;
        mapLocalHost[mapLocalHost_entry] = lsi;
    }

    // create a peer with an IPv4 address
    in_addr ipv4AddrPeer;
    ipv4AddrPeer.s_addr = 0xa0b0c001;
    CAddress addr = CAddress(CService(ipv4AddrPeer, 7777), NODE_NETWORK);
    std::unique_ptr<CNode> pnode = std::make_unique<CNode>(/*id=*/0,
                                                           /*sock=*/nullptr,
                                                           addr,
                                                           /*nKeyedNetGroupIn=*/0,
                                                           /*nLocalHostNonceIn=*/0,
                                                           CAddress{},
                                                           /*pszDest=*/std::string{},
                                                           ConnectionType::OUTBOUND_FULL_RELAY,
                                                           /*inbound_onion=*/false);
    pnode->fSuccessfullyConnected.store(true);

    // the peer claims to be reaching us via IPv6
    in6_addr ipv6AddrLocal;
    memset(ipv6AddrLocal.s6_addr, 0, 16);
    ipv6AddrLocal.s6_addr[0] = 0xcc;
    CAddress addrLocal = CAddress(CService(ipv6AddrLocal, 7777), NODE_NETWORK);
    pnode->SetAddrLocal(addrLocal);

    // before patch, this causes undefined behavior detectable with clang's -fsanitize=memory
    GetLocalAddrForPeer(*pnode);

    // suppress no-checks-run warning; if this test fails, it's by triggering a sanitizer
    BOOST_CHECK(1);

    // Cleanup, so that we don't confuse other tests.
    {
        LOCK(g_maplocalhost_mutex);
        mapLocalHost.erase(mapLocalHost_entry);
    }
}